

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_avx2.c
# Opt level: O0

void obmc_variance_w16n(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse,int *sum,
                       int w,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long in_RCX;
  long in_RDX;
  int in_ESI;
  undefined1 (*in_RDI) [16];
  undefined4 *in_R8;
  undefined4 *in_R9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int in_stack_00000008;
  __m256i v_sqrdiff_d;
  __m256i v_rdiff01_w;
  __m256i v_rdiff1_d;
  __m256i v_rdiff2_d;
  __m256i v_rdiff0_d;
  __m256i v_tmp1_d;
  __m256i v_tmp0_d;
  __m256i v_sign1_d;
  __m256i v_sign0_d;
  __m256i v_diff1_d;
  __m256i v_diff0_d;
  __m256i v_pm1_d;
  __m256i v_pm0_d;
  __m256i v_p1_d;
  __m256i v_p0_d;
  __m256i v_w1_d;
  __m256i v_m1_d;
  __m256i v_w0_d;
  __m256i v_m0_d;
  __m128i v_p_b;
  __m256i v_sse_d;
  __m256i v_sum_d;
  __m256i v_bias_d;
  uint8_t *pre_temp;
  __m128i res0;
  __m256i v_d;
  int height;
  int width;
  int n;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 (*local_6f8) [16];
  int local_6a4;
  int local_6a0;
  int local_69c;
  undefined1 (*local_670) [16];
  ulong uStack_638;
  ulong local_5e0;
  undefined4 local_c0;
  undefined4 local_a0;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_69c = 0;
  local_6a4 = w;
  auVar8 = vpinsrd_avx(ZEXT416(0x800),0x800,1);
  auVar8 = vpinsrd_avx(auVar8,0x800,2);
  auVar8 = vpinsrd_avx(auVar8,0x800,3);
  auVar7 = vpinsrd_avx(ZEXT416(0x800),0x800,1);
  auVar7 = vpinsrd_avx(auVar7,0x800,2);
  auVar7 = vpinsrd_avx(auVar7,0x800,3);
  uStack_70 = auVar7._0_8_;
  uStack_68 = auVar7._8_8_;
  uStack_638 = SUB328(ZEXT832(0),4);
  local_740 = ZEXT832(uStack_638) << 0x40;
  local_760 = ZEXT832(uStack_638) << 0x40;
  local_670 = in_RDI;
  do {
    local_6a0 = in_stack_00000008;
    local_6f8 = local_670;
    do {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)*local_6f8;
      auVar2 = vpmovzxbd_avx2(auVar7);
      auVar7 = vpsrldq_avx(*local_6f8,8);
      local_5e0 = auVar7._0_8_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_5e0;
      auVar3 = vpmovzxbd_avx2(auVar1);
      auVar2 = vpmaddwd_avx2(auVar2,*(undefined1 (*) [32])(in_RCX + (long)local_69c * 4));
      auVar3 = vpmaddwd_avx2(auVar3,*(undefined1 (*) [32])(in_RCX + 0x20 + (long)local_69c * 4));
      auVar2 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDX + (long)local_69c * 4),auVar2);
      auVar5 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDX + 0x20 + (long)local_69c * 4),auVar3);
      auVar3 = vpsrad_avx2(auVar2,ZEXT416(0x1f));
      auVar4 = vpsrad_avx2(auVar5,ZEXT416(0x1f));
      auVar6._16_8_ = uStack_70;
      auVar6._0_16_ = auVar8;
      auVar6._24_8_ = uStack_68;
      auVar2 = vpaddd_avx2(auVar2,auVar6);
      auVar2 = vpaddd_avx2(auVar2,auVar3);
      auVar3._16_8_ = uStack_70;
      auVar3._0_16_ = auVar8;
      auVar3._24_8_ = uStack_68;
      auVar3 = vpaddd_avx2(auVar5,auVar3);
      auVar3 = vpaddd_avx2(auVar3,auVar4);
      auVar2 = vpsrad_avx2(auVar2,ZEXT416(0xc));
      auVar4 = vpsrad_avx2(auVar3,ZEXT416(0xc));
      auVar3 = vpaddd_avx2(auVar2,auVar4);
      auVar2 = vpackssdw_avx2(auVar2,auVar4);
      auVar2 = vpmaddwd_avx2(auVar2,auVar2);
      local_740 = vpaddd_avx2(local_740,auVar3);
      local_760 = vpaddd_avx2(local_760,auVar2);
      local_6f8 = local_6f8 + 1;
      local_69c = local_69c + 0x10;
      local_6a0 = local_6a0 + -0x10;
    } while (0 < local_6a0);
    local_670 = (undefined1 (*) [16])(*local_670 + in_ESI);
    local_6a4 = local_6a4 + -1;
  } while (0 < local_6a4);
  auVar2 = vphaddd_avx2(local_740,local_760);
  auVar2 = vphaddd_avx2(auVar2,auVar2);
  auVar8 = vpaddd_avx(auVar2._0_16_,auVar2._16_16_);
  local_a0 = auVar8._0_4_;
  *in_R9 = local_a0;
  auVar8 = vpsrldq_avx(auVar8,4);
  local_c0 = auVar8._0_4_;
  *in_R8 = local_c0;
  return;
}

Assistant:

static inline void obmc_variance_w16n(const uint8_t *pre, const int pre_stride,
                                      const int32_t *wsrc, const int32_t *mask,
                                      unsigned int *const sse, int *const sum,
                                      const int w, const int h) {
  int n = 0, width, height = h;
  __m256i v_d;
  __m128i res0;
  const uint8_t *pre_temp;
  const __m256i v_bias_d = _mm256_set1_epi32((1 << 12) >> 1);
  __m256i v_sum_d = _mm256_setzero_si256();
  __m256i v_sse_d = _mm256_setzero_si256();

  assert(w >= 16);
  assert(IS_POWER_OF_TWO(w));
  assert(IS_POWER_OF_TWO(h));
  do {
    width = w;
    pre_temp = pre;
    do {
      const __m128i v_p_b = _mm_loadu_si128((__m128i *)pre_temp);
      const __m256i v_m0_d = _mm256_loadu_si256((__m256i const *)(mask + n));
      const __m256i v_w0_d = _mm256_loadu_si256((__m256i const *)(wsrc + n));
      const __m256i v_m1_d =
          _mm256_loadu_si256((__m256i const *)(mask + n + 8));
      const __m256i v_w1_d =
          _mm256_loadu_si256((__m256i const *)(wsrc + n + 8));

      const __m256i v_p0_d = _mm256_cvtepu8_epi32(v_p_b);
      const __m256i v_p1_d = _mm256_cvtepu8_epi32(_mm_srli_si128(v_p_b, 8));

      const __m256i v_pm0_d = _mm256_madd_epi16(v_p0_d, v_m0_d);
      const __m256i v_pm1_d = _mm256_madd_epi16(v_p1_d, v_m1_d);

      const __m256i v_diff0_d = _mm256_sub_epi32(v_w0_d, v_pm0_d);
      const __m256i v_diff1_d = _mm256_sub_epi32(v_w1_d, v_pm1_d);

      const __m256i v_sign0_d = _mm256_srai_epi32(v_diff0_d, 31);
      const __m256i v_sign1_d = _mm256_srai_epi32(v_diff1_d, 31);

      const __m256i v_tmp0_d =
          _mm256_add_epi32(_mm256_add_epi32(v_diff0_d, v_bias_d), v_sign0_d);
      const __m256i v_tmp1_d =
          _mm256_add_epi32(_mm256_add_epi32(v_diff1_d, v_bias_d), v_sign1_d);

      const __m256i v_rdiff0_d = _mm256_srai_epi32(v_tmp0_d, 12);
      const __m256i v_rdiff2_d = _mm256_srai_epi32(v_tmp1_d, 12);

      const __m256i v_rdiff1_d = _mm256_add_epi32(v_rdiff0_d, v_rdiff2_d);
      const __m256i v_rdiff01_w = _mm256_packs_epi32(v_rdiff0_d, v_rdiff2_d);
      const __m256i v_sqrdiff_d = _mm256_madd_epi16(v_rdiff01_w, v_rdiff01_w);

      v_sum_d = _mm256_add_epi32(v_sum_d, v_rdiff1_d);
      v_sse_d = _mm256_add_epi32(v_sse_d, v_sqrdiff_d);

      pre_temp += 16;
      n += 16;
      width -= 16;
    } while (width > 0);
    pre += pre_stride;
    height -= 1;
  } while (height > 0);

  v_d = _mm256_hadd_epi32(v_sum_d, v_sse_d);
  v_d = _mm256_hadd_epi32(v_d, v_d);
  res0 = _mm256_castsi256_si128(v_d);
  res0 = _mm_add_epi32(res0, _mm256_extractf128_si256(v_d, 1));
  *sum = _mm_cvtsi128_si32(res0);
  *sse = (unsigned int)_mm_cvtsi128_si32(_mm_srli_si128(res0, 4));
}